

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

void u_UCharsToChars_63(UChar *us,char *cs,int32_t length)

{
  long lVar1;
  UChar UVar2;
  
  lVar1 = 0;
  for (; 0 < length; length = length + -1) {
    UVar2 = us[lVar1];
    if ((0x7f < (ushort)UVar2) ||
       ((invariantChars[(ushort)UVar2 >> 5] >> ((ushort)UVar2 & 0x1f) & 1) == 0)) {
      UVar2 = L'\0';
    }
    cs[lVar1] = (char)UVar2;
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_UCharsToChars(const UChar *us, char *cs, int32_t length) {
    UChar u;

    while(length>0) {
        u=*us++;
        if(!UCHAR_IS_INVARIANT(u)) {
            U_ASSERT(FALSE); /* Variant characters were used. These are not portable in ICU. */
            u=0;
        }
        *cs++=(char)UCHAR_TO_CHAR(u);
        --length;
    }
}